

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

int __thiscall QDateTimeEditPrivate::closestSection(QDateTimeEditPrivate *this,int pos,bool forward)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  SectionNode SVar6;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)pos < *(long *)(*(long *)&this->field_0x428 + 0x10)) {
    iVar3 = (uint)forward * 2 + -2;
  }
  else {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d._0_4_ = 0xaaaaaaaa;
    local_58.d.d._4_4_ = 0xaaaaaaaa;
    local_58.d.ptr._0_4_ = 0xaaaaaaaa;
    local_58.d.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (&local_58,this);
    if (*(long *)(*(long *)&this->field_0x428 + -8 + *(long *)&this->field_0x430 * 0x18) <
        local_58.d.size - pos) {
      updateCache(this,&(this->super_QAbstractSpinBoxPrivate).value,&local_58);
      if (*(long *)&this->field_0x418 != 0) {
        lVar5 = 8;
        uVar4 = 0;
        do {
          SVar6._8_8_ = *(undefined8 *)(*(long *)&this->field_0x410 + -8 + lVar5);
          SVar6._0_8_ = &this->super_QDateTimeParser;
          iVar3 = QDateTimeParser::sectionPos(SVar6);
          iVar2 = QDateTimeParser::sectionSize((int)&this->super_QDateTimeParser);
          if (pos < iVar2 + iVar3) {
            uVar4 = (ulong)((int)uVar4 - (uint)(!forward && pos < iVar3));
            goto LAB_003e63af;
          }
          if (iVar3 < pos && uVar4 == *(ulong *)&this->field_0x418 - 1) goto LAB_003e63af;
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x10;
        } while (uVar4 < *(ulong *)&this->field_0x418);
      }
      closestSection();
      uVar4 = 0xffffffff;
    }
    else {
      uVar4 = 0xfffffffd;
      if (!forward) {
        uVar4 = (ulong)(*(int *)&this->field_0x418 - 1);
      }
    }
LAB_003e63af:
    iVar3 = (int)uVar4;
    piVar1 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),2,0x10)
        ;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QDateTimeEditPrivate::closestSection(int pos, bool forward) const
{
    Q_ASSERT(pos >= 0);
    if (pos < separators.first().size())
        return forward ? 0 : FirstSectionIndex;

    const QString text = displayText();
    if (text.size() - pos < separators.last().size() + 1)
        return forward ? LastSectionIndex : int(sectionNodes.size() - 1);

    updateCache(value, text);
    for (int i=0; i<sectionNodes.size(); ++i) {
        const int tmp = sectionPos(sectionNodes.at(i));
        if (pos < tmp + sectionSize(i)) {
            if (pos < tmp && !forward) {
                return i-1;
            }
            return i;
        } else if (i == sectionNodes.size() - 1 && pos > tmp) {
            return i;
        }
    }
    qWarning("QDateTimeEdit: Internal Error: closestSection returned NoSection");
    return NoSectionIndex;
}